

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

bool __thiscall S2Polyline::NearlyCovers(S2Polyline *this,S2Polyline *covered,S1Angle max_error)

{
  size_t *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  S2Point *pSVar5;
  S2Point *pSVar6;
  S2Point *b;
  reference pvVar7;
  pair<std::_Rb_tree_const_iterator<(anonymous_namespace)::SearchState>,_bool> pVar8;
  bool local_1da;
  SearchState local_194;
  double local_188;
  SearchState local_17c;
  double local_170;
  S2Point local_168;
  S2Point local_150;
  undefined1 auStack_138 [8];
  S2Point j_begin;
  undefined1 auStack_118 [8];
  S2Point i_begin;
  int next_j;
  int next_i_1;
  undefined1 local_c8 [8];
  SearchState state;
  S1Angle local_a8;
  undefined1 local_a0 [8];
  S2Point closest_point;
  int next_next_i;
  int local_78;
  int local_74;
  int next_i;
  int i;
  set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
  done;
  vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
  pending;
  S2Polyline *covered_local;
  S2Polyline *this_local;
  S1Angle max_error_local;
  
  iVar2 = num_vertices(covered);
  if (iVar2 == 0) {
    max_error_local.radians_._7_1_ = true;
  }
  else {
    iVar2 = num_vertices(this);
    if (iVar2 == 0) {
      max_error_local.radians_._7_1_ = false;
    }
    else {
      std::
      vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ::vector((vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
      ::set((set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
             *)&next_i);
      local_74 = 0;
      local_78 = anon_unknown.dwarf_405395::NextDistinctVertex(this,0);
      while (iVar2 = num_vertices(this), local_78 < iVar2) {
        closest_point.c_[2]._0_4_ = anon_unknown.dwarf_405395::NextDistinctVertex(this,local_78);
        pSVar5 = vertex(covered,0);
        pSVar6 = vertex(this,local_74);
        b = vertex(this,local_78);
        S2::Project((S2Point *)local_a0,pSVar5,pSVar6,b);
        iVar2 = closest_point.c_[2]._0_4_;
        iVar3 = num_vertices(this);
        if (iVar2 == iVar3) {
LAB_004ce929:
          pSVar5 = vertex(covered,0);
          S1Angle::S1Angle(&local_a8,(S2Point *)local_a0,pSVar5);
          local_1da = operator<=(local_a8,max_error);
        }
        else {
          pSVar5 = vertex(this,local_78);
          bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                            ((BasicVector<Vector3,_double,_3UL> *)local_a0,pSVar5);
          local_1da = false;
          if (bVar1) goto LAB_004ce929;
        }
        if (local_1da != false) {
          anon_unknown.dwarf_405395::SearchState::SearchState
                    ((SearchState *)&state.j,local_74,0,true);
          std::
          vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
          ::push_back((vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                       *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (value_type *)&state.j);
        }
        local_74 = local_78;
        local_78 = closest_point.c_[2]._0_4_;
      }
      while (bVar1 = std::
                     vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                     ::empty((vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                              *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        this_00 = &done._M_t._M_impl.super__Rb_tree_header._M_node_count;
        pvVar7 = std::
                 vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                 ::back((vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                         *)this_00);
        state.i = *(int *)&pvVar7->i_in_progress;
        local_c8._0_4_ = pvVar7->i;
        local_c8._4_4_ = pvVar7->j;
        std::
        vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
        ::pop_back((vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                    *)this_00);
        pVar8 = std::
                set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
                ::insert((set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
                          *)&next_i,(value_type *)local_c8);
        if (((pVar8.second ^ 0xffU) & 1) == 0) {
          iVar2 = anon_unknown.dwarf_405395::NextDistinctVertex(this,local_c8._0_4_);
          iVar3 = anon_unknown.dwarf_405395::NextDistinctVertex(covered,local_c8._4_4_);
          iVar4 = num_vertices(covered);
          if (iVar3 == iVar4) {
            max_error_local.radians_._7_1_ = true;
            goto LAB_004cee6d;
          }
          iVar4 = num_vertices(this);
          if (iVar2 != iVar4) {
            Vector3<double>::Vector3((Vector3<double> *)auStack_118);
            Vector3<double>::Vector3((Vector3<double> *)auStack_138);
            if ((state.i & 1U) == 0) {
              pSVar5 = vertex(this,local_c8._0_4_);
              i_begin.c_[1] = pSVar5->c_[2];
              auStack_118 = (undefined1  [8])pSVar5->c_[0];
              i_begin.c_[0] = pSVar5->c_[1];
              pSVar5 = vertex(covered,local_c8._4_4_);
              pSVar6 = vertex(covered,iVar3);
              S2::Project(&local_168,(S2Point *)auStack_118,pSVar5,pSVar6);
              auStack_138 = (undefined1  [8])local_168.c_[0];
              j_begin.c_[0] = local_168.c_[1];
              j_begin.c_[1] = local_168.c_[2];
            }
            else {
              pSVar5 = vertex(covered,local_c8._4_4_);
              j_begin.c_[1] = pSVar5->c_[2];
              auStack_138 = (undefined1  [8])pSVar5->c_[0];
              j_begin.c_[0] = pSVar5->c_[1];
              pSVar5 = vertex(this,local_c8._0_4_);
              pSVar6 = vertex(this,iVar2);
              S2::Project(&local_150,(S2Point *)auStack_138,pSVar5,pSVar6);
              auStack_118 = (undefined1  [8])local_150.c_[0];
              i_begin.c_[0] = local_150.c_[1];
              i_begin.c_[1] = local_150.c_[2];
            }
            pSVar5 = vertex(covered,iVar3);
            pSVar6 = vertex(this,iVar2);
            local_170 = max_error.radians_;
            bVar1 = S2::IsEdgeBNearEdgeA
                              ((S2Point *)auStack_138,pSVar5,(S2Point *)auStack_118,pSVar6,max_error
                              );
            if (bVar1) {
              anon_unknown.dwarf_405395::SearchState::SearchState
                        (&local_17c,iVar2,local_c8._4_4_,false);
              std::
              vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
              ::push_back((vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                           *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_17c);
            }
            pSVar5 = vertex(this,iVar2);
            pSVar6 = vertex(covered,iVar3);
            local_188 = max_error.radians_;
            bVar1 = S2::IsEdgeBNearEdgeA
                              ((S2Point *)auStack_118,pSVar5,(S2Point *)auStack_138,pSVar6,max_error
                              );
            if (bVar1) {
              anon_unknown.dwarf_405395::SearchState::SearchState
                        (&local_194,local_c8._0_4_,iVar3,true);
              std::
              vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
              ::push_back((vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                           *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_194);
            }
          }
        }
      }
      max_error_local.radians_._7_1_ = false;
LAB_004cee6d:
      std::
      set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
      ::~set((set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
              *)&next_i);
      std::
      vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
      ::~vector((vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                 *)&done._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  return max_error_local.radians_._7_1_;
}

Assistant:

bool S2Polyline::NearlyCovers(const S2Polyline& covered,
                              S1Angle max_error) const {
  // NOTE: This algorithm is described assuming that adjacent vertices in a
  // polyline are never at the same point.  That is, the ith and i+1th vertices
  // of a polyline are never at the same point in space.  The implementation
  // does not make this assumption.

  // DEFINITIONS:
  //   - edge "i" of a polyline is the edge from the ith to i+1th vertex.
  //   - covered_j is a polyline consisting of edges 0 through j of "covered."
  //   - this_i is a polyline consisting of edges 0 through i of this polyline.
  //
  // A search state is represented as an (int, int, bool) tuple, (i, j,
  // i_in_progress).  Using the "drive a car" analogy from the header comment, a
  // search state signifies that you can drive one car along "covered" from its
  // first vertex through a point on its jth edge, and another car along this
  // polyline from some point on or before its ith edge to a to a point on its
  // ith edge, such that no car ever goes backward, and the cars are always
  // within "max_error" of each other.  If i_in_progress is true, it means that
  // you can definitely drive along "covered" through the jth vertex (beginning
  // of the jth edge). Otherwise, you can definitely drive along "covered"
  // through the point on the jth edge of "covered" closest to the ith vertex of
  // this polyline.
  //
  // The algorithm begins by finding all edges of this polyline that are within
  // "max_error" of the first vertex of "covered," and adding search states
  // representing all of these possible starting states to the stack of
  // "pending" states.
  //
  // The algorithm proceeds by popping the next pending state,
  // (i,j,i_in_progress), off of the stack.  First it checks to see if that
  // state represents finding a valid covering of "covered" and returns true if
  // so.  Next, if the state represents reaching the end of this polyline
  // without finding a successful covering, the algorithm moves on to the next
  // state in the stack.  Otherwise, if state (i+1,j,false) is valid, it is
  // added to the stack of pending states.  Same for state (i,j+1,true).
  //
  // We need the stack because when "i" and "j" can both be incremented,
  // sometimes only one choice leads to a solution.  We use a set to keep track
  // of visited states to avoid duplicating work.  With the set, the worst-case
  // number of states examined is O(n+m) where n = this->num_vertices() and m =
  // covered.num_vertices().  Without it, the amount of work could be as high as
  // O((n*m)^2).  Using set, the running time is O((n*m) log (n*m)).
  //
  // TODO(user): Benchmark this, and see if the set is worth it.

  if (covered.num_vertices() == 0) return true;
  if (this->num_vertices() == 0) return false;

  vector<SearchState> pending;
  set<SearchState, SearchStateKeyCompare> done;

  // Find all possible starting states.
  for (int i = 0, next_i = NextDistinctVertex(*this, 0), next_next_i;
       next_i < this->num_vertices(); i = next_i, next_i = next_next_i) {
    next_next_i = NextDistinctVertex(*this, next_i);
    S2Point closest_point = S2::Project(
        covered.vertex(0), this->vertex(i), this->vertex(next_i));

    // In order to avoid duplicate starting states, we exclude the end vertex
    // of each edge *except* for the last non-degenerate edge.
    if ((next_next_i == this->num_vertices() ||
         closest_point != this->vertex(next_i)) &&
        S1Angle(closest_point, covered.vertex(0)) <= max_error) {
      pending.push_back(SearchState(i, 0, true));
    }
  }

  while (!pending.empty()) {
    const SearchState state = pending.back();
    pending.pop_back();
    if (!done.insert(state).second) continue;

    const int next_i = NextDistinctVertex(*this, state.i);
    const int next_j = NextDistinctVertex(covered, state.j);
    if (next_j == covered.num_vertices()) {
      return true;
    } else if (next_i == this->num_vertices()) {
      continue;
    }

    S2Point i_begin, j_begin;
    if (state.i_in_progress) {
      j_begin = covered.vertex(state.j);
      i_begin = S2::Project(
          j_begin, this->vertex(state.i), this->vertex(next_i));
    } else {
      i_begin = this->vertex(state.i);
      j_begin = S2::Project(
          i_begin, covered.vertex(state.j), covered.vertex(next_j));
    }

    if (S2::IsEdgeBNearEdgeA(j_begin, covered.vertex(next_j),
                             i_begin, this->vertex(next_i), max_error)) {
      pending.push_back(SearchState(next_i, state.j, false));
    }
    if (S2::IsEdgeBNearEdgeA(i_begin, this->vertex(next_i),
                             j_begin, covered.vertex(next_j), max_error)) {
      pending.push_back(SearchState(state.i, next_j, true));
    }
  }
  return false;
}